

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_lan.c
# Opt level: O2

olsrv2_lan_entry *
olsrv2_lan_add(nhdp_domain *domain,os_route_key *prefix,uint32_t metric,uint8_t distance)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  long lVar11;
  uint8_t uVar12;
  olsrv2_lan_entry *poVar13;
  bool bVar14;
  bool bVar15;
  
  lVar11 = avl_find(&_lan_tree);
  if (lVar11 == 0) {
    poVar13 = (olsrv2_lan_entry *)oonf_class_malloc(&_lan_class);
    if (poVar13 == (olsrv2_lan_entry *)0x0) {
      return (olsrv2_lan_entry *)0x0;
    }
    *(undefined4 *)((poVar13->prefix).src._addr + 0xe) = *(undefined4 *)((prefix->src)._addr + 0xe);
    uVar4 = *(undefined4 *)(prefix->dst)._addr;
    uVar5 = *(undefined4 *)((prefix->dst)._addr + 4);
    uVar6 = *(undefined4 *)((prefix->dst)._addr + 8);
    uVar7 = *(undefined4 *)((prefix->dst)._addr + 0xc);
    uVar8 = *(undefined4 *)((prefix->src)._addr + 2);
    uVar9 = *(undefined4 *)((prefix->src)._addr + 6);
    uVar10 = *(undefined4 *)((prefix->src)._addr + 10);
    *(undefined4 *)&(poVar13->prefix).dst._type = *(undefined4 *)&(prefix->dst)._type;
    *(undefined4 *)((poVar13->prefix).src._addr + 2) = uVar8;
    *(undefined4 *)((poVar13->prefix).src._addr + 6) = uVar9;
    *(undefined4 *)((poVar13->prefix).src._addr + 10) = uVar10;
    *(undefined4 *)(poVar13->prefix).dst._addr = uVar4;
    *(undefined4 *)((poVar13->prefix).dst._addr + 4) = uVar5;
    *(undefined4 *)((poVar13->prefix).dst._addr + 8) = uVar6;
    *(undefined4 *)((poVar13->prefix).dst._addr + 0xc) = uVar7;
    (poVar13->_node).key = poVar13;
    avl_insert(&_lan_tree,&poVar13->_node);
    poVar13->same_distance = true;
    for (lVar11 = 100; lVar11 != 0x84; lVar11 = lVar11 + 8) {
      puVar1 = (poVar13->prefix).dst._addr + lVar11;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = '\0';
    }
  }
  else {
    poVar13 = (olsrv2_lan_entry *)(lVar11 + -0x28);
  }
  iVar3 = domain->index;
  poVar13->_domaindata[iVar3].outgoing_metric = metric;
  poVar13->_domaindata[iVar3].distance = distance;
  poVar13->_domaindata[iVar3].active = true;
  olsrv2_routing_domain_changed(domain,true);
  poVar13->same_distance = true;
  lVar11 = 0xd;
  uVar12 = '\0';
  while( true ) {
    if (lVar11 == 0x11) {
      return poVar13;
    }
    if (((poVar13->prefix).dst._addr[lVar11 * 8 + 1] == '\x01') &&
       (bVar14 = uVar12 != '\0', uVar2 = (poVar13->prefix).dst._addr[lVar11 * 8],
       bVar15 = uVar12 != uVar2, uVar12 = uVar2, bVar15 && bVar14)) break;
    lVar11 = lVar11 + 1;
  }
  poVar13->same_distance = false;
  return poVar13;
}

Assistant:

struct olsrv2_lan_entry *
olsrv2_lan_add(struct nhdp_domain *domain, const struct os_route_key *prefix, uint32_t metric, uint8_t distance) {
  struct olsrv2_lan_entry *entry;
  struct olsrv2_lan_domaindata *lan_data;
  uint8_t tmp_dist;
  int i;

  entry = olsrv2_lan_get(prefix);
  if (entry == NULL) {
    entry = oonf_class_malloc(&_lan_class);
    if (entry == NULL) {
      return NULL;
    }

    /* copy key and append to tree */
    memcpy(&entry->prefix, prefix, sizeof(*prefix));
    entry->_node.key = &entry->prefix;
    avl_insert(&_lan_tree, &entry->_node);

    entry->same_distance = true;

    /* initialize linkcost */
    for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
      entry->_domaindata[i].outgoing_metric = RFC7181_METRIC_INFINITE;
    }
  }

  lan_data = olsrv2_lan_get_domaindata(domain, entry);
  lan_data->outgoing_metric = metric;
  lan_data->distance = distance;
  lan_data->active = true;
  olsrv2_routing_domain_changed(domain, true);

  tmp_dist = 0;
  entry->same_distance = true;
  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    lan_data = &entry->_domaindata[i];
    if (lan_data->active) {
      if (tmp_dist == 0) {
        /* copy first valid distance */
        tmp_dist = lan_data->distance;
      }
      if (tmp_dist != lan_data->distance) {
        /* we found a difference */
        entry->same_distance = false;
        break;
      }
    }
  }
  return entry;
}